

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall
crnlib::dynamic_string::set(dynamic_string *this,dynamic_string *other,uint max_len)

{
  ushort uVar1;
  char *__src;
  uint uVar2;
  
  if (this == other) {
    if (max_len < this->m_len) {
      this->m_pStr[max_len] = '\0';
      this->m_len = (uint16)max_len;
    }
  }
  else {
    uVar2 = (uint)other->m_len;
    if (max_len < other->m_len) {
      uVar2 = max_len;
    }
    if (uVar2 == 0) {
      clear(this);
    }
    else {
      uVar1 = this->m_buf_size;
      if (uVar1 <= uVar2 && uVar2 != 0xffff) {
        expand_buf(this,uVar2 + 1,false);
        uVar1 = this->m_buf_size;
      }
      if (uVar2 < uVar1) {
        this->m_len = (uint16)uVar2;
        __src = "";
        if (other->m_pStr != (char *)0x0) {
          __src = other->m_pStr;
        }
        memcpy(this->m_pStr,__src,(ulong)uVar2);
        this->m_pStr[uVar2] = '\0';
      }
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const dynamic_string& other, uint max_len)
    {
        if (this == &other)
        {
            if (max_len < m_len)
            {
                m_pStr[max_len] = '\0';
                m_len = static_cast<uint16>(max_len);
            }
        }
        else
        {
            const uint len = math::minimum<uint>(max_len, other.m_len);

            if (!len)
            {
                clear();
            }
            else if (ensure_buf(len, false))
            {
                m_len = static_cast<uint16>(len);
                memcpy(m_pStr, other.get_ptr_priv(), m_len);
                m_pStr[len] = '\0';
            }
        }

        check();

        return *this;
    }